

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::enterRubberBandMode(QMdiSubWindowPrivate *this)

{
  long lVar1;
  QLatin1StringView str;
  bool bVar2;
  int ax;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  QWidget *p;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *q;
  QPoint rubberBandPos;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  QWidget *in_stack_ffffffffffffff88;
  QRubberBand *pQVar5;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa8;
  Shape s;
  
  s = (Shape)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QWidget;
  bVar2 = QWidget::isMaximized(this_00);
  if (!bVar2) {
    if (in_RDI->rubberBand == (QRubberBand *)0x0) {
      p = (QWidget *)operator_new(0x28);
      QWidget::parentWidget((QWidget *)0x62d5a6);
      QRubberBand::QRubberBand((QRubberBand *)in_RDI,s,p);
      in_RDI->rubberBand = (QRubberBand *)p;
      pQVar5 = in_RDI->rubberBand;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      str.m_size._4_4_ = in_stack_ffffffffffffff94;
      str.m_size._0_4_ = in_stack_ffffffffffffff90;
      str.m_data._0_4_ = in_stack_ffffffffffffff98;
      str.m_data._4_4_ = in_stack_ffffffffffffff9c;
      QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_ffffffffffffff88,str);
      QObject::setObjectName((QAnyStringView *)pQVar5);
    }
    QPoint::QPoint((QPoint *)this_00,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    QWidget::mapToParent(in_stack_ffffffffffffff88,(QPoint *)this_00);
    pQVar5 = in_RDI->rubberBand;
    ax = QPoint::x((QPoint *)0x62d66e);
    iVar3 = QPoint::y((QPoint *)0x62d67c);
    iVar4 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QRubberBand::setGeometry
              ((QRubberBand *)CONCAT44(iVar4,iVar3),ax,in_stack_ffffffffffffff90,
               (int)((ulong)pQVar5 >> 0x20),(int)pQVar5);
    QWidget::show((QWidget *)CONCAT44(ax,in_stack_ffffffffffffff90));
    in_RDI->isInRubberBandMode = true;
    QWidget::grabMouse((QWidget *)0x62d6e6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::enterRubberBandMode()
{
    Q_Q(QMdiSubWindow);
    if (q->isMaximized())
        return;
    Q_ASSERT(oldGeometry.isValid());
    Q_ASSERT(parent);
    if (!rubberBand) {
        rubberBand = new QRubberBand(QRubberBand::Rectangle, q->parentWidget());
        // For accessibility to identify this special widget.
        rubberBand->setObjectName("qt_rubberband"_L1);
    }
    QPoint rubberBandPos = q->mapToParent(QPoint(0, 0));
    rubberBand->setGeometry(rubberBandPos.x(), rubberBandPos.y(),
                            oldGeometry.width(), oldGeometry.height());
    rubberBand->show();
    isInRubberBandMode = true;
    q->grabMouse();
}